

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::Block::
is_empty<(ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
          (Block *this)

{
  bool bVar1;
  undefined8 in_RDI;
  size_t i;
  atomic<bool> *this_00;
  
  this_00 = (atomic<bool> *)0x0;
  while( true ) {
    if ((atomic<bool> *)0x1f < this_00) {
      return true;
    }
    bVar1 = std::atomic<bool>::load(this_00,(memory_order)((ulong)in_RDI >> 0x20));
    if (!bVar1) break;
    this_00 = this_00 + 1;
  }
  return false;
}

Assistant:

inline bool is_empty() const {
      MOODYCAMEL_CONSTEXPR_IF(context == explicit_context &&
                              QUEUE_BLOCK_SIZE <=
                                  EXPLICIT_BLOCK_EMPTY_COUNTER_THRESHOLD) {
        // Check flags
        for (size_t i = 0; i < QUEUE_BLOCK_SIZE; ++i) {
          if (!emptyFlags[i].load(std::memory_order_relaxed)) {
            return false;
          }
        }

        // Aha, empty; make sure we have all other memory effects that happened
        // before the empty flags were set
        std::atomic_thread_fence(std::memory_order_acquire);
        return true;
      }
      else {
        // Check counter
        if (elementsCompletelyDequeued.load(std::memory_order_relaxed) ==
            QUEUE_BLOCK_SIZE) {
          std::atomic_thread_fence(std::memory_order_acquire);
          return true;
        }
        assert(elementsCompletelyDequeued.load(std::memory_order_relaxed) <=
               QUEUE_BLOCK_SIZE);
        return false;
      }